

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btMultiBody.cpp
# Opt level: O1

void __thiscall btMultiBody::finalizeMultiDof(btMultiBody *this)

{
  undefined8 *puVar1;
  undefined8 *puVar2;
  int *piVar3;
  undefined8 uVar4;
  float *pfVar5;
  btVector3 *ptr;
  btMultibodyLink *pbVar6;
  float *pfVar7;
  btVector3 *pbVar8;
  long lVar9;
  int iVar10;
  long lVar11;
  int iVar12;
  
  iVar12 = (this->m_deltaV).m_size;
  lVar11 = (long)iVar12;
  if ((lVar11 < 1) && (iVar12 < 0)) {
    if ((this->m_deltaV).m_capacity < 0) {
      pfVar7 = (this->m_deltaV).m_data;
      if (pfVar7 != (float *)0x0) {
        if ((this->m_deltaV).m_ownsMemory == true) {
          btAlignedFreeInternal(pfVar7);
        }
        (this->m_deltaV).m_data = (float *)0x0;
      }
      (this->m_deltaV).m_ownsMemory = true;
      (this->m_deltaV).m_data = (float *)0x0;
      (this->m_deltaV).m_capacity = 0;
    }
    if (iVar12 < 0) {
      memset((this->m_deltaV).m_data + lVar11,0,lVar11 * -4);
    }
  }
  (this->m_deltaV).m_size = 0;
  iVar12 = this->m_dofCount;
  lVar11 = (long)iVar12 + 6;
  iVar10 = (int)lVar11;
  if ((-7 < (long)iVar12) && (iVar12 != -6)) {
    if ((this->m_deltaV).m_capacity < iVar10) {
      pfVar7 = (float *)btAlignedAllocInternal(lVar11 * 4,0x10);
      lVar11 = (long)(this->m_deltaV).m_size;
      if (0 < lVar11) {
        pfVar5 = (this->m_deltaV).m_data;
        lVar9 = 0;
        do {
          pfVar7[lVar9] = pfVar5[lVar9];
          lVar9 = lVar9 + 1;
        } while (lVar11 != lVar9);
      }
      pfVar5 = (this->m_deltaV).m_data;
      if (pfVar5 != (float *)0x0) {
        if ((this->m_deltaV).m_ownsMemory == true) {
          btAlignedFreeInternal(pfVar5);
        }
        (this->m_deltaV).m_data = (float *)0x0;
      }
      (this->m_deltaV).m_ownsMemory = true;
      (this->m_deltaV).m_data = pfVar7;
      (this->m_deltaV).m_capacity = iVar10;
    }
    if (iVar12 != -6) {
      memset((this->m_deltaV).m_data,0,(long)iVar10 << 2);
    }
  }
  (this->m_deltaV).m_size = iVar10;
  iVar10 = (this->m_dofCount + 2) * this->m_dofCount + 0xc;
  iVar12 = (this->m_realBuf).m_size;
  if ((iVar12 <= iVar10) && (iVar12 < iVar10)) {
    if ((this->m_realBuf).m_capacity < iVar10) {
      if (iVar10 == 0) {
        pfVar7 = (float *)0x0;
      }
      else {
        pfVar7 = (float *)btAlignedAllocInternal((long)iVar10 << 2,0x10);
      }
      lVar11 = (long)(this->m_realBuf).m_size;
      if (0 < lVar11) {
        pfVar5 = (this->m_realBuf).m_data;
        lVar9 = 0;
        do {
          pfVar7[lVar9] = pfVar5[lVar9];
          lVar9 = lVar9 + 1;
        } while (lVar11 != lVar9);
      }
      pfVar5 = (this->m_realBuf).m_data;
      if (pfVar5 != (float *)0x0) {
        if ((this->m_realBuf).m_ownsMemory == true) {
          btAlignedFreeInternal(pfVar5);
        }
        (this->m_realBuf).m_data = (float *)0x0;
      }
      (this->m_realBuf).m_ownsMemory = true;
      (this->m_realBuf).m_data = pfVar7;
      (this->m_realBuf).m_capacity = iVar10;
    }
    if (iVar12 < iVar10) {
      memset((this->m_realBuf).m_data + iVar12,0,((long)iVar10 - (long)iVar12) * 4);
    }
  }
  (this->m_realBuf).m_size = iVar10;
  iVar12 = this->m_dofCount;
  iVar10 = iVar12 * 2;
  if (((this->m_vectorBuf).m_size < iVar10) && ((this->m_vectorBuf).m_capacity < iVar10)) {
    if (iVar12 == 0) {
      pbVar8 = (btVector3 *)0x0;
    }
    else {
      pbVar8 = (btVector3 *)btAlignedAllocInternal((long)iVar12 << 5,0x10);
    }
    lVar11 = (long)(this->m_vectorBuf).m_size;
    if (0 < lVar11) {
      lVar9 = 0;
      do {
        puVar1 = (undefined8 *)((long)((this->m_vectorBuf).m_data)->m_floats + lVar9);
        uVar4 = puVar1[1];
        puVar2 = (undefined8 *)((long)pbVar8->m_floats + lVar9);
        *puVar2 = *puVar1;
        puVar2[1] = uVar4;
        lVar9 = lVar9 + 0x10;
      } while (lVar11 * 0x10 != lVar9);
    }
    ptr = (this->m_vectorBuf).m_data;
    if (ptr != (btVector3 *)0x0) {
      if ((this->m_vectorBuf).m_ownsMemory == true) {
        btAlignedFreeInternal(ptr);
      }
      (this->m_vectorBuf).m_data = (btVector3 *)0x0;
    }
    (this->m_vectorBuf).m_ownsMemory = true;
    (this->m_vectorBuf).m_data = pbVar8;
    (this->m_vectorBuf).m_capacity = iVar10;
  }
  (this->m_vectorBuf).m_size = iVar10;
  lVar11 = (long)(this->m_links).m_size;
  if (0 < lVar11) {
    pbVar6 = (this->m_links).m_data;
    iVar12 = 0;
    iVar10 = 0;
    lVar9 = 0;
    do {
      piVar3 = (int *)((long)(pbVar6->m_cachedRotParentToThis).super_btQuadWord.m_floats +
                      lVar9 + -8);
      *piVar3 = iVar12;
      piVar3[1] = iVar10;
      uVar4 = *(undefined8 *)
               ((long)(pbVar6->m_cachedWorldTransform).m_basis.m_el[0].m_floats + lVar9 + -0x14);
      iVar12 = iVar12 + (int)uVar4;
      iVar10 = iVar10 + (int)((ulong)uVar4 >> 0x20);
      lVar9 = lVar9 + 600;
    } while (lVar11 * 600 - lVar9 != 0);
  }
  return;
}

Assistant:

void btMultiBody::finalizeMultiDof()
{
	m_deltaV.resize(0);
	m_deltaV.resize(6 + m_dofCount);
	m_realBuf.resize(6 + m_dofCount + m_dofCount*m_dofCount + 6 + m_dofCount);			//m_dofCount for joint-space vels + m_dofCount^2 for "D" matrices + delta-pos vector (6 base "vels" + joint "vels")
	m_vectorBuf.resize(2 * m_dofCount);													//two 3-vectors (i.e. one six-vector) for each system dof	("h" matrices)

	updateLinksDofOffsets();
}